

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Label.cpp
# Opt level: O2

void __thiscall entities::Label::Label(Label *this,Chunk *chunk,uint tileIndex)

{
  int iVar1;
  ResourceBase *pRVar2;
  undefined4 extraout_var;
  LodRenderer *pLVar3;
  repr coords;
  locale local_70 [8];
  path local_68;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_48
  ;
  
  Entity::Entity(&this->super_Entity,chunk,tileIndex);
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR__Label_0026d2d0;
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Label_0026d308;
  std::locale::locale(local_70);
  sf::String::String((String *)&local_48,"",local_70);
  pRVar2 = Locator::getResource();
  ghc::filesystem::path::path<char[23],ghc::filesystem::path>
            (&local_68,(char (*) [23])"resources/consolas.ttf",auto_format);
  iVar1 = (*pRVar2->_vptr_ResourceBase[3])(pRVar2,&local_68);
  sf::Text::Text(&this->text_,(String *)&local_48,(Font *)CONCAT44(extraout_var,iVar1),0x1e);
  ghc::filesystem::path::~path(&local_68);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string(&local_48);
  std::locale::~locale(local_70);
  spdlog::debug<char[31]>((char (*) [31])"Label entity has been created.");
  pLVar3 = Chunk::getLodRenderer(chunk);
  if (pLVar3 != (LodRenderer *)0x0) {
    pLVar3 = Chunk::getLodRenderer(chunk);
    coords = Chunk::getCoords(chunk);
    LodRenderer::addDecoration(pLVar3,coords,tileIndex,&this->super_Drawable);
  }
  return;
}

Assistant:

Label::Label(Chunk& chunk, unsigned int tileIndex) :
    Entity(chunk, tileIndex),
    text_("", Locator::getResource()->getFont("resources/consolas.ttf"), 30) {

    spdlog::debug("Label entity has been created.");
    if (chunk.getLodRenderer() != nullptr) {
        chunk.getLodRenderer()->addDecoration(chunk.getCoords(), tileIndex, this);
    }
}